

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianPoint::IfcCartesianPoint(IfcCartesianPoint *this)

{
  *(undefined ***)&this->field_0x58 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x60 = 0;
  *(char **)&this->field_0x68 = "IfcCartesianPoint";
  IfcPoint::IfcPoint(&this->super_IfcPoint,&PTR_construction_vtable_24__0088ebf0);
  *(undefined8 *)&(this->super_IfcPoint).field_0x38 = 0;
  (this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x88eb38;
  *(undefined8 *)&this->field_0x58 = 0x88ebd8;
  *(undefined8 *)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x88eb60;
  *(undefined8 *)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x88eb88;
  *(undefined8 *)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x30 = 0x88ebb0;
  *(undefined8 *)&(this->super_IfcPoint).field_0x40 = 0;
  *(undefined8 *)&this->field_0x48 = 0;
  *(undefined8 *)&this->field_0x50 = 0;
  return;
}

Assistant:

IfcCartesianPoint() : Object("IfcCartesianPoint") {}